

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,Terminator *term,void *data)

{
  bool bVar1;
  LexicalScoping LVar2;
  undefined8 uVar3;
  SemanticAnalysisVisitor *in_RDX;
  long in_RSI;
  SemanticAnalysisVisitor *in_RDI;
  ExpVarData *exp_var_data;
  
  *(undefined4 *)(in_RSI + 0x28) = *(undefined4 *)&(in_RDX->super_Visitor)._vptr_Visitor;
  if ((*(int *)(in_RSI + 0x20) != 0x115) && (*(int *)&(in_RDX->super_Visitor)._vptr_Visitor != 1)) {
    __assert_fail("exp_var_data->semantic_op_ == SemanticOp_Read",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                  ,0x1ce,"virtual void luna::SemanticAnalysisVisitor::Visit(Terminator *, void *)");
  }
  switch(*(undefined4 *)(in_RSI + 0x20)) {
  case 0x106:
  case 0x112:
    *(undefined4 *)((long)&(in_RDX->super_Visitor)._vptr_Visitor + 4) = 2;
    break;
  case 0x10c:
    *(undefined4 *)((long)&(in_RDX->super_Visitor)._vptr_Visitor + 4) = 1;
    break;
  case 0x115:
    *(undefined4 *)((long)&(in_RDX->super_Visitor)._vptr_Visitor + 4) = 0;
    break;
  case 0x116:
    *(undefined4 *)((long)&(in_RDX->super_Visitor)._vptr_Visitor + 4) = 4;
    break;
  case 0x117:
    *(undefined4 *)((long)&(in_RDX->super_Visitor)._vptr_Visitor + 4) = 3;
    break;
  case 0x11d:
    *(undefined4 *)((long)&(in_RDX->super_Visitor)._vptr_Visitor + 4) = 5;
  }
  if (*(int *)(in_RSI + 0x20) == 0x115) {
    LVar2 = SearchName(in_RDX,(String *)in_RDX);
    *(LexicalScoping *)(in_RSI + 0x2c) = LVar2;
  }
  if ((*(int *)(in_RSI + 0x20) == 0x11d) && (bVar1 = HasVararg(in_RDI), !bVar1)) {
    uVar3 = __cxa_allocate_exception(0x20);
    SemanticException::SemanticException((SemanticException *)this,(char *)term,(TokenDetail *)data)
    ;
    __cxa_throw(uVar3,&SemanticException::typeinfo,SemanticException::~SemanticException);
  }
  if (*(int *)(in_RSI + 0x20) == 0x11d) {
    *(undefined1 *)&in_RDX->state_ = 1;
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(Terminator *term, void *data)
    {
        // Current term read and write semantic
        auto exp_var_data = static_cast<ExpVarData *>(data);
        term->semantic_ = exp_var_data->semantic_op_;
        if (term->token_.token_ != Token_Id)
            assert(exp_var_data->semantic_op_ == SemanticOp_Read);

        // Set Expression type
        switch (term->token_.token_)
        {
            case Token_Nil: exp_var_data->exp_type_ = ExpType_Nil; break;
            case Token_Id: exp_var_data->exp_type_ = ExpType_Unknown; break;
            case Token_Number: exp_var_data->exp_type_ = ExpType_Number; break;
            case Token_String: exp_var_data->exp_type_ = ExpType_String; break;
            case Token_VarArg: exp_var_data->exp_type_ = ExpType_VarArg; break;
            case Token_True: case Token_False: exp_var_data->exp_type_ = ExpType_Bool; break;
        }

        // Search lexical scoping of name
        if (term->token_.token_ == Token_Id)
            term->scoping_ = SearchName(term->token_.str_);

        // Check function has vararg
        if (term->token_.token_ == Token_VarArg && !HasVararg())
            throw SemanticException("function has no '...' param", term->token_);

        // Set results any count
        if (term->token_.token_ == Token_VarArg)
            exp_var_data->results_any_count_ = true;
    }